

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfile.hh
# Opt level: O0

void __thiscall
helix::nasdaq::binaryfile_session<helix::nasdaq::itch50_handler>::register_callback
          (binaryfile_session<helix::nasdaq::itch50_handler> *this,event_callback *callback)

{
  itch50_handler *this_00;
  long in_RDI;
  event_callback *in_stack_ffffffffffffffa8;
  function<void_(const_helix::event_&)> *in_stack_ffffffffffffffc0;
  function<void_(const_helix::event_&)> local_30;
  
  this_00 = (itch50_handler *)(in_RDI + 0x10);
  std::function<void_(const_helix::event_&)>::function(in_stack_ffffffffffffffc0,&local_30);
  itch50_handler::register_callback(this_00,in_stack_ffffffffffffffa8);
  std::function<void_(const_helix::event_&)>::~function
            ((function<void_(const_helix::event_&)> *)0x13ed46);
  return;
}

Assistant:

void binaryfile_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}